

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall CWire::AdjustBoundary(CWire *this,CLayer *pLayer,int iBlocakge)

{
  int iVar1;
  int iVar2;
  CBoundary *pCVar3;
  bool bVar4;
  int local_48;
  int i_1;
  int iMaxY;
  int iMinY;
  int iX;
  int i;
  int iMaxX;
  int iMinX;
  int iY;
  CDesign *pDesign;
  int iBlocakge_local;
  CLayer *pLayer_local;
  CWire *this_local;
  
  iVar1 = CPoint::X(this->m_pPointS);
  iVar2 = CPoint::X(this->m_pPointE);
  if (iVar2 < iVar1) {
    __assert_fail("m_pPointS->X()<=m_pPointE->X()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x5d6,"void CWire::AdjustBoundary(CLayer *, int)");
  }
  iVar1 = IsFlat(this);
  bVar4 = true;
  if (iVar1 == 0) {
    iVar1 = IsPoint(this);
    bVar4 = iVar1 != 0;
  }
  if (!bVar4) {
    __assert_fail("IsFlat()||IsPoint()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x5d7,"void CWire::AdjustBoundary(CLayer *, int)");
  }
  iVar1 = IsPoint(this);
  if (iVar1 == 0) {
    CObject::GetDesign();
    iVar1 = IsHorizontal(this);
    if (iVar1 == 0) {
      iVar1 = IsVertical(this);
      if (iVar1 != 0) {
        iVar1 = CPoint::X(this->m_pPointS);
        iVar2 = CPoint::X(this->m_pPointE);
        if (iVar1 != iVar2) {
          __assert_fail("m_pPointS->X()==m_pPointE->X()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x5ee,"void CWire::AdjustBoundary(CLayer *, int)");
        }
        iVar1 = CPoint::X(this->m_pPointS);
        local_48 = CPoint::Y(this->m_pPointS);
        iVar2 = CPoint::Y(this->m_pPointE);
        if (iVar2 <= local_48) {
          __assert_fail("iMinY<iMaxY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x5f3,"void CWire::AdjustBoundary(CLayer *, int)");
        }
        for (; local_48 < iVar2; local_48 = local_48 + 1) {
          pCVar3 = CLayer::GetBoundary(pLayer,iVar1,local_48);
          CBoundary::AdjustCapacity(pCVar3,iBlocakge);
        }
      }
    }
    else {
      iVar1 = CPoint::Y(this->m_pPointS);
      iVar2 = CPoint::Y(this->m_pPointE);
      if (iVar1 != iVar2) {
        __assert_fail("m_pPointS->Y()==m_pPointE->Y()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5e2,"void CWire::AdjustBoundary(CLayer *, int)");
      }
      iVar1 = CPoint::Y(this->m_pPointS);
      iMinY = CPoint::X(this->m_pPointS);
      iVar2 = CPoint::X(this->m_pPointE);
      if (iVar2 <= iMinY) {
        __assert_fail("iMinX<iMaxX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5e8,"void CWire::AdjustBoundary(CLayer *, int)");
      }
      for (; iMinY < iVar2; iMinY = iMinY + 1) {
        pCVar3 = CLayer::GetBoundary(pLayer,iMinY,iVar1);
        CBoundary::AdjustCapacity(pCVar3,iBlocakge);
      }
    }
  }
  return;
}

Assistant:

void CWire::AdjustBoundary(CLayer* pLayer, int iBlocakge)
{
	// need to have a valid layer [6/18/2006 thyeros]
	assert(m_pPointS->X()<=m_pPointE->X());
	assert(IsFlat()||IsPoint());

	if(IsPoint())	return;

	//////////////////////////////////////////////////////////////////////////
	// congestion and density are updated here [6/28/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	CDesign*	pDesign		=	GetDesign();

	if(IsHorizontal())
	{
		assert(m_pPointS->Y()==m_pPointE->Y());
		int	iY		=	m_pPointS->Y();
		int iMinX	=	m_pPointS->X();
		int	iMaxX	=	m_pPointE->X();

		// the last point doesn't require to update boundary [6/18/2006 thyeros]
		assert(iMinX<iMaxX);

		for (int i=iMinX;i<iMaxX;++i)	pLayer->GetBoundary(i,iY)->AdjustCapacity(iBlocakge);
	}
	else if(IsVertical())
	{
		assert(m_pPointS->X()==m_pPointE->X());
		int	iX		=	m_pPointS->X();
		int iMinY	=	m_pPointS->Y();
		int	iMaxY	=	m_pPointE->Y();

		assert(iMinY<iMaxY);

		for (int i=iMinY;i<iMaxY;++i)	pLayer->GetBoundary(iX,i)->AdjustCapacity(iBlocakge);
	}
}